

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O0

char * parse_dst_rule(os_tzrule_t *rule,char *p,size_t *len)

{
  ushort **ppuVar1;
  char *pcVar2;
  ulong *in_RDX;
  char *in_RSI;
  int *in_RDI;
  char *start;
  int *in_stack_fffffffffffffff8;
  
  pcVar2 = in_RSI;
  if ((*in_RDX < 2) ||
     (((*in_RSI != 'J' && (*in_RSI != 'j')) ||
      (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)pcVar2[1]] & 0x800) == 0)))) {
    if ((*in_RDX == 0) || (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*pcVar2] & 0x800) == 0)) {
      if (*in_RDX < 2) {
        return pcVar2;
      }
      if (*pcVar2 != 'M') {
        return pcVar2;
      }
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)pcVar2[1]] & 0x800) == 0) {
        return pcVar2;
      }
      *in_RDX = *in_RDX - 1;
      pcVar2 = parse_digits(in_RDI,pcVar2 + 1,in_RDX);
      if (in_RDI[2] < 1) {
        return in_RSI;
      }
      if (0xc < in_RDI[2]) {
        return in_RSI;
      }
      if (*in_RDX < 2) {
        return in_RSI;
      }
      if (*pcVar2 != '.') {
        return in_RSI;
      }
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)pcVar2[1]] & 0x800) == 0) {
        return in_RSI;
      }
      *in_RDX = *in_RDX - 1;
      pcVar2 = parse_digits(in_RDI,pcVar2 + 1,in_RDX);
      if (in_RDI[3] < 1) {
        return in_RSI;
      }
      if (5 < in_RDI[3]) {
        return in_RSI;
      }
      if (*in_RDX < 2) {
        return in_RSI;
      }
      if (*pcVar2 != '.') {
        return in_RSI;
      }
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)pcVar2[1]] & 0x800) == 0) {
        return in_RSI;
      }
      *in_RDX = *in_RDX - 1;
      pcVar2 = parse_digits(in_RDI,pcVar2 + 1,in_RDX);
      in_RDI[4] = in_RDI[4] + 1;
      if (in_RDI[4] < 1) {
        return in_RSI;
      }
      if (7 < in_RDI[4]) {
        return in_RSI;
      }
    }
    else {
      pcVar2 = parse_digits(in_RDI,pcVar2,in_RDX);
      in_RDI[1] = in_RDI[1] + 1;
    }
  }
  else {
    *in_RDX = *in_RDX - 1;
    pcVar2 = parse_digits(in_RDI,pcVar2 + 1,in_RDX);
  }
  if (((*in_RDX < 2) || (*pcVar2 != '/')) ||
     (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)pcVar2[1]] & 0x800) == 0)) {
    in_RDI[5] = 0x1c20;
  }
  else {
    *in_RDX = *in_RDX - 1;
    pcVar2 = parse_offset(in_stack_fffffffffffffff8,(char *)in_RDI,(size_t *)(pcVar2 + 1));
  }
  return pcVar2;
}

Assistant:

static const char *parse_dst_rule(struct os_tzrule_t *rule,
                                  const char *p, size_t *len)
{
    /* remember the starting point - we'll return this on failure */
    const char *start = p;

    /* check the date portion */
    if (*len >= 2 && (*p == 'J' || *p == 'j') && isdigit(p[1]))
    {
        /* Julian day, not counting February 29 */
        ++p, --*len;
        p = parse_digits(&rule->jday, p, len);
    }
    else if (*len >= 1 && isdigit(*p))
    {
        /* day of year, counting February 29 */
        p = parse_digits(&rule->yday, p, len);

        /* TZ uses range 0-365 for this format, but yday uses 1-366 */
        rule->yday += 1;
    }
    else if (*len >= 2 && *p == 'M' && isdigit(p[1]))
    {
        /* month.week.day format - start with the month */
        ++p, --*len;
        p = parse_digits(&rule->month, p, len);
        if (rule->month < 1 || rule->month > 12)
            return start;

        /* check for the required '.' and a following digit */
        if (*len < 2 || *p != '.' || !isdigit(p[1]))
            return start;

        /* parse the week */
        ++p, --*len;
        p = parse_digits(&rule->week, p, len);
        if (rule->week < 1 || rule->week > 5)
            return start;
        
        /* check for the required '.' and a following digit */
        if (*len < 2 || *p != '.' || !isdigit(p[1]))
            return start;
        
        /* parse the day of the week; adjust from 0-6 to our 1-7 range */
        ++p, --*len;
        p = parse_digits(&rule->day, p, len);
        rule->day += 1;
        if (rule->day < 1 || rule->day > 7)
            return start;
    }
    else
    {
        /* not a valid DST start/end format */
        return p;
    }

    /* we got the date; check for a time portion */
    if (*len >= 2 && *p == '/' && isdigit(p[1]))
    {
        /* parse the time; this has the same parsing rules as an offset */
        ++p, --*len;
        p = parse_offset(&rule->time, p, len);
    }
    else
    {
        /* the default is 2:00 AM */
        rule->time = 2*60*60;
    }

    /* success - return the updated pointer */
    return p;
}